

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void do_shifts(TCGContext_conflict9 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a,TCGv_i32 s,
              TCGOpcode opc_s,TCGOpcode opc_v)

{
  TCGType_conflict type_00;
  int iVar1;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGArg a0;
  TCGArg a_00;
  TCGArg b;
  TCGOpcode *n;
  TCGv_vec r_00;
  TCGv_i64 ret;
  TCGv_i64 s64;
  TCGv_vec vec_s;
  int can;
  TCGOpcode *hold_list;
  TCGType_conflict type;
  TCGArg si;
  TCGArg ai;
  TCGArg ri;
  TCGTemp *st;
  TCGTemp *at;
  TCGTemp *rt;
  TCGOpcode opc_s_local;
  TCGv_i32 s_local;
  TCGv_vec a_local;
  TCGv_vec r_local;
  uint vece_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  ts = tcgv_vec_temp(tcg_ctx,r);
  ts_00 = tcgv_vec_temp(tcg_ctx,a);
  ts_01 = tcgv_i32_temp(tcg_ctx,s);
  a0 = temp_arg(ts);
  a_00 = temp_arg(ts_00);
  b = temp_arg(ts_01);
  type_00 = (TCGType_conflict)((ulong)*(undefined8 *)ts >> 0x10) & 0xff;
  tcg_assert_listed_vecop(opc_s);
  n = tcg_swap_vecop_list((TCGOpcode *)0x0);
  iVar1 = tcg_can_emit_vec_op_tricore(tcg_ctx,opc_s,type_00,vece);
  if (iVar1 < 1) {
    if (iVar1 < 0) {
      tcg_expand_vec_op_tricore(tcg_ctx,opc_s,type_00,vece,a0,a_00,b);
    }
    else {
      r_00 = tcg_temp_new_vec_tricore(tcg_ctx,type_00);
      if (vece == 3) {
        ret = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_extu_i32_i64_tricore(tcg_ctx,ret,s);
        tcg_gen_dup_i64_vec_tricore(tcg_ctx,3,r_00,ret);
        tcg_temp_free_i64(tcg_ctx,ret);
      }
      else {
        tcg_gen_dup_i32_vec_tricore(tcg_ctx,vece,r_00,s);
      }
      do_op3_nofail(tcg_ctx,vece,r,a,r_00,opc_v);
      tcg_temp_free_vec(tcg_ctx,r_00);
    }
  }
  else {
    vec_gen_3_tricore(tcg_ctx,opc_s,type_00,vece,a0,a_00,b);
  }
  tcg_swap_vecop_list(n);
  return;
}

Assistant:

static void do_shifts(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a,
                      TCGv_i32 s, TCGOpcode opc_s, TCGOpcode opc_v)
{
    TCGTemp *rt = tcgv_vec_temp(tcg_ctx, r);
    TCGTemp *at = tcgv_vec_temp(tcg_ctx, a);
    TCGTemp *st = tcgv_i32_temp(tcg_ctx, s);
    TCGArg ri = temp_arg(rt);
    TCGArg ai = temp_arg(at);
    TCGArg si = temp_arg(st);
    TCGType type = rt->base_type;
    const TCGOpcode *hold_list;
    int can;

    tcg_debug_assert(at->base_type >= type);
    tcg_assert_listed_vecop(opc_s);
    hold_list = tcg_swap_vecop_list(NULL);

    can = tcg_can_emit_vec_op(tcg_ctx, opc_s, type, vece);
    if (can > 0) {
        vec_gen_3(tcg_ctx, opc_s, type, vece, ri, ai, si);
    } else if (can < 0) {
        tcg_expand_vec_op(tcg_ctx, opc_s, type, vece, ri, ai, si);
    } else {
        TCGv_vec vec_s = tcg_temp_new_vec(tcg_ctx, type);

        if (vece == MO_64) {
            TCGv_i64 s64 = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_extu_i32_i64(tcg_ctx, s64, s);
            tcg_gen_dup_i64_vec(tcg_ctx, MO_64, vec_s, s64);
            tcg_temp_free_i64(tcg_ctx, s64);
        } else {
            tcg_gen_dup_i32_vec(tcg_ctx, vece, vec_s, s);
        }
        do_op3_nofail(tcg_ctx, vece, r, a, vec_s, opc_v);
        tcg_temp_free_vec(tcg_ctx, vec_s);
    }
    tcg_swap_vecop_list(hold_list);
}